

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::commit_app_log
          (raft_server *this,ulong idx_to_commit,ptr<log_entry> *le,bool need_to_handle_commit_elem)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  ulong uVar3;
  element_type *peVar4;
  _Base_ptr p_Var5;
  element_type *peVar6;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this_00;
  _List_node_base *p_Var7;
  long *plVar8;
  element_type *peVar9;
  undefined8 uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  int iVar12;
  _Node *p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  _Base_ptr p_Var15;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *__tmp;
  const_iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  bool bVar17;
  ptr<commit_ret_elem> elem;
  ptr<std::exception> err;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  async_elems;
  ptr<buffer> buf;
  unique_lock<std::mutex> cre_lock;
  shared_ptr<nuraft::raft_server::commit_ret_elem> local_a8;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  buffer *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  local_68;
  undefined1 local_50 [16];
  unique_lock<std::mutex> local_40;
  
  local_78 = (buffer *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50._0_8_ =
       (peVar2->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50._8_8_ =
       (peVar2->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
    }
  }
  buffer::pos((buffer *)local_50._0_8_,0);
  uVar3 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
  if (uVar3 < idx_to_commit) {
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar6 != (element_type *)0x0) &&
       (iVar12 = (**(code **)(*(long *)peVar6 + 0x38))(), 0 < iVar12)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,"pre-commit index %lu is smaller than commit index %lu",uVar3,
                 idx_to_commit);
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_app_log",0x131,local_98);
      if ((buffer *)local_98._0_8_ != (buffer *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    plVar8 = *(long **)&(((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_
                        ).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar8 + 0x40))(plVar8,0xffffffe9);
    exit(-1);
  }
  peVar4 = (this->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_50;
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)idx_to_commit;
  (*peVar4->_vptr_state_machine[3])
            (local_98,peVar4,(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68);
  uVar10 = local_98._8_8_;
  local_78 = (buffer *)local_98._0_8_;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (element_type *)0x0;
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    _Stack_70._M_pi = _Var11._M_pi;
    _Var11._M_pi = _Stack_70._M_pi;
  }
  _Stack_70._M_pi = _Var11._M_pi;
  if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if (local_78 != (buffer *)0x0) {
    buffer::pos(local_78,0);
  }
  local_68._M_impl._M_node._M_size = 0;
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
  if (!need_to_handle_commit_elem) goto LAB_00194299;
  local_40._M_device = &this->commit_ret_elems_lock_;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  bVar17 = uVar3 == idx_to_commit;
  p_Var1 = &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var15 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < idx_to_commit]) {
    if (*(ulong *)(p_Var5 + 1) >= idx_to_commit) {
      p_Var15 = p_Var5;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
     (__position._M_node = p_Var15, idx_to_commit < *(ulong *)(p_Var15 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    local_a8.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)__position._M_node[1]._M_parent;
    local_a8.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__position._M_node[1]._M_left;
    if ((_Base_ptr)
        local_a8.
        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((_Base_ptr)
                 local_a8.
                 super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)
                      local_a8.
                      super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&((_Base_ptr)
                 local_a8.
                 super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)
                      local_a8.
                      super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_parent + 1;
      }
    }
    if ((local_a8.
         super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->idx_ == idx_to_commit) {
      (local_a8.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->result_code_ = OK;
      ((local_a8.
        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->ret_value_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_a8.
                    super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->ret_value_).
                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &_Stack_70);
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar6 != (element_type *)0x0) &&
         (iVar12 = (**(code **)(*(long *)peVar6 + 0x38))(), 4 < iVar12)) {
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_98,"notify cb %lu %p",idx_to_commit,
                   &(local_a8.
                     super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->awaiter_);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_app_log",0x151,local_98);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_);
        }
      }
      context::get_params((context *)local_98);
      iVar12 = *(int *)(local_98._0_8_ + 0x58);
      if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      if (iVar12 == 1) {
        p_Var13 = std::__cxx11::
                  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                  ::_M_create_node<std::shared_ptr<nuraft::raft_server::commit_ret_elem>const&>
                            ((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                              *)&local_68,&local_a8);
        std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
        local_68._M_impl._M_node._M_size = (long)(_func_int ***)local_68._M_impl._M_node._M_size + 1
        ;
LAB_0019409f:
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
        ::_M_erase_aux(&(this->commit_ret_elems_)._M_t,__position);
      }
      else {
        if ((local_a8.
             super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->callback_invoked_ != false) goto LAB_0019409f;
        EventAwaiter::invoke
                  (&(local_a8.
                     super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->awaiter_);
      }
      bVar17 = false;
    }
    if ((_Base_ptr)
        local_a8.
        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.
                 super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (bVar17) {
    local_a8.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::raft_server::commit_ret_elem,std::allocator<nuraft::raft_server::commit_ret_elem>>
              (&local_a8.
                super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(commit_ret_elem **)&local_a8,
               (allocator<nuraft::raft_server::commit_ret_elem> *)local_98);
    (local_a8.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->idx_ = idx_to_commit;
    (local_a8.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->result_code_ = OK;
    ((local_a8.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->ret_value_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_78;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_a8.
                  super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->ret_value_).
                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &_Stack_70);
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar6 != (element_type *)0x0) &&
       (iVar12 = (**(code **)(*(long *)peVar6 + 0x38))(), 5 < iVar12)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,
                 "commit thread is invoked earlier than user thread, log %lu, elem %p",idx_to_commit
                 ,local_a8.
                  super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_app_log",0x171,local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    context::get_params((context *)local_98);
    iVar12 = *(int *)(local_98._0_8_ + 0x58);
    if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    peVar9 = local_a8.
             super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (iVar12 == 1) {
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xe0);
      p_Var14->_M_use_count = 1;
      p_Var14->_M_weak_count = 1;
      p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bd320;
      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
                ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                 (p_Var14 + 1),&peVar9->ret_value_,OK);
      ((local_a8.
        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->async_result_).
      super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                (p_Var14 + 1);
      p_Var16 = ((local_a8.
                  super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->async_result_).
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      ((local_a8.
        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->async_result_).
      super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var14;
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
    }
    else {
      EventAwaiter::invoke
                (&(local_a8.
                   super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->awaiter_);
    }
    local_98._8_8_ =
         local_a8.
         super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_88._M_allocated_capacity =
         (size_type)
         local_a8.
         super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Base_ptr)
        local_a8.
        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.
         super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.
              super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.
         super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.
              super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_98._0_8_ = idx_to_commit;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
    ::
    _M_emplace_unique<std::pair<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                *)&this->commit_ret_elems_,
               (pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)
               local_98);
    if ((_Base_ptr)local_88._M_allocated_capacity != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_allocated_capacity);
    }
    if ((_Base_ptr)
        local_a8.
        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.
                 super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
LAB_00194299:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_68._M_impl._M_node.super__List_node_base._M_next !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68) {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_68._M_impl._M_node.super__List_node_base._M_next;
    do {
      this_00 = (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                ((_List_node_base *)p_Var16[1]._vptr__Sp_counted_base)[0xc]._M_next;
      if (this_00 !=
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)0x0) {
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = (element_type *)0x0;
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
                  (this_00,(shared_ptr<nuraft::buffer> *)
                           &((_List_node_base *)p_Var16[1]._vptr__Sp_counted_base)[10]._M_prev,
                   (shared_ptr<std::exception> *)local_98,OK);
        p_Var7 = (_List_node_base *)p_Var16[1]._vptr__Sp_counted_base;
        p_Var7[10]._M_prev = (_List_node_base *)0x0;
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[0xb]._M_next;
        p_Var7[0xb]._M_next = (_List_node_base *)0x0;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        p_Var7 = (_List_node_base *)p_Var16[1]._vptr__Sp_counted_base;
        p_Var7[0xc]._M_next = (_List_node_base *)0x0;
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[0xc]._M_prev;
        p_Var7[0xc]._M_prev = (_List_node_base *)0x0;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (((_List_impl *)&p_Var16->_vptr__Sp_counted_base)->_M_node).super__List_node_base.
                _M_next;
    } while (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  ::_M_clear(&local_68);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  return;
}

Assistant:

void raft_server::commit_app_log(ulong idx_to_commit,
                                 ptr<log_entry>& le,
                                 bool need_to_handle_commit_elem)
{
    ptr<buffer> ret_value = nullptr;
    ptr<buffer> buf = le->get_buf_ptr();
    buf->pos(0);
    ulong sm_idx = idx_to_commit;
    ulong pc_idx = precommit_index_.load();
    if (pc_idx < sm_idx) {
        // Pre-commit should have been invoked, must be a bug.
        p_ft( "pre-commit index %" PRIu64 " is smaller than commit index %" PRIu64,
              pc_idx, sm_idx );
        ctx_->state_mgr_->system_exit(raft_err::N23_precommit_order_inversion);
        ::exit(-1);
    }
    ret_value = state_machine_->commit_ext
                ( state_machine::ext_op_params( sm_idx, buf ) );
    if (ret_value) ret_value->pos(0);

    std::list< ptr<commit_ret_elem> > async_elems;
    if (need_to_handle_commit_elem) {
        std::unique_lock<std::mutex> cre_lock(commit_ret_elems_lock_);
        /// Sometimes user can batch requests to RAFT: for example send 30
        /// append entries requests in a single batch. For such request batch
        /// user will receive a single response: all was successful or all
        /// failed. Obviously we don't need to add info about responses
        /// (commit_ret_elems) for 29 requests from batch and need to do it only
        /// for 30-th request. precommit_index is exact value which identify ID
        /// of the last request from the latest batch. So if we commiting this
        /// last request and for some reason it was not added into
        /// commit_ret_elems in the handle_cli_req method (logical race
        /// condition) we have to add it here. Otherwise we don't need to add
        /// anything into commit_ret_elems_, because nobody will wait for the
        /// responses of the intermediate requests from requests batch.
        bool need_to_check_commit_ret = sm_idx == pc_idx;

        auto entry = commit_ret_elems_.find(sm_idx);
        if (entry != commit_ret_elems_.end()) {
            ptr<commit_ret_elem> elem = entry->second;
            if (elem->idx_ == sm_idx) {
                elem->result_code_ = cmd_result_code::OK;
                elem->ret_value_ = ret_value;
                need_to_check_commit_ret = false;
                p_dv("notify cb %" PRIu64 " %p", sm_idx, &elem->awaiter_);

                switch (ctx_->get_params()->return_method_) {
                case raft_params::blocking:
                default:
                    // Blocking mode:
                    if (elem->callback_invoked_) {
                        // If elem callback invoked, remove it
                        commit_ret_elems_.erase(entry);
                    } else {
                        // or notify client that request done
                        elem->awaiter_.invoke();
                    }
                    break;

                case raft_params::async_handler:
                    // Async handler: put into list.
                    async_elems.push_back(elem);
                    commit_ret_elems_.erase(entry);
                    break;
                }
            }
        }

        if (need_to_check_commit_ret) {
            // If not found, commit thread is invoked earlier than user thread.
            // Create one here.
            ptr<commit_ret_elem> elem = cs_new<commit_ret_elem>();
            elem->idx_ = sm_idx;
            elem->result_code_ = cmd_result_code::OK;
            elem->ret_value_ = ret_value;
            p_tr("commit thread is invoked earlier than user thread, "
                 "log %" PRIu64 ", elem %p", sm_idx, elem.get());

            switch (ctx_->get_params()->return_method_) {
            case raft_params::blocking:
            default:
                elem->awaiter_.invoke(); // Callback will not sleep.
                break;
            case raft_params::async_handler:
                // Async handler:
                //   Set the result, but should not put it into the
                //   `async_elems` list, as the user thread (supposed to be
                //   executed right after this) will invoke the callback immediately.
                elem->async_result_ =
                    cs_new< cmd_result< ptr<buffer> > >( elem->ret_value_ );
                break;
            }
            commit_ret_elems_.insert( std::make_pair(sm_idx, elem) );
        }
    }

    // Calling handler should be done outside the mutex.
    for (auto& entry: async_elems) {
        ptr<commit_ret_elem>& elem = entry;
        if (elem->async_result_) {
            ptr<std::exception> err = nullptr;
            elem->async_result_->set_result( elem->ret_value_, err, cmd_result_code::OK );
            elem->ret_value_.reset();
            elem->async_result_.reset();
        }
    }
}